

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_class_type_filter.hpp
# Opt level: O0

uint32_t __thiscall
libtorrent::peer_class_type_filter::apply
          (peer_class_type_filter *this,socket_type_t st,uint32_t peer_class_mask)

{
  uint uVar1;
  reference pvVar2;
  uint32_t peer_class_mask_local;
  socket_type_t st_local;
  peer_class_type_filter *this_local;
  
  this_local._4_4_ = peer_class_mask;
  if (st < num_socket_types) {
    pvVar2 = ::std::array<unsigned_int,_6UL>::operator[](&this->m_peer_class_type_mask,(ulong)st);
    uVar1 = *pvVar2;
    pvVar2 = ::std::array<unsigned_int,_6UL>::operator[](&this->m_peer_class_type,(ulong)st);
    this_local._4_4_ = *pvVar2 | uVar1 & peer_class_mask;
  }
  return this_local._4_4_;
}

Assistant:

std::uint32_t apply(socket_type_t const st, std::uint32_t peer_class_mask)
		{
			TORRENT_ASSERT(st < num_socket_types);
			if (st >= num_socket_types) return peer_class_mask;

			// filter peer classes based on type
			peer_class_mask &= m_peer_class_type_mask[st];
			// add peer classes based on type
			peer_class_mask |= m_peer_class_type[st];
			return peer_class_mask;
		}